

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O0

uint __thiscall
glcts::DrawBuffersIndexedBlending::NumComponents(DrawBuffersIndexedBlending *this,GLenum format)

{
  GLenum format_local;
  DrawBuffersIndexedBlending *this_local;
  
  if (format == 0x8051) {
    return 3;
  }
  if (format - 0x8056 < 4) {
    return 4;
  }
  if (format == 0x8229) {
LAB_015835bf:
    this_local._4_4_ = 1;
  }
  else {
    if (format != 0x822b) {
      if (format - 0x8231 < 6) goto LAB_015835bf;
      if (5 < format - 0x8237) {
        if (format == 0x8d62) {
          return 3;
        }
        if (format == 0x8d70) {
          return 4;
        }
        if (format == 0x8d76) {
          return 4;
        }
        if (format == 0x8d7c) {
          return 4;
        }
        if (format == 0x8d82) {
          return 4;
        }
        if (format == 0x8d88) {
          return 4;
        }
        if (format == 0x8d8e) {
          return 4;
        }
        return 0;
      }
    }
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int DrawBuffersIndexedBlending::NumComponents(glw::GLenum format)
{
	switch (format)
	{
	case GL_R8:
	case GL_R8I:
	case GL_R8UI:
	case GL_R16I:
	case GL_R16UI:
	case GL_R32I:
	case GL_R32UI:
		return 1;
	case GL_RG8:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG32I:
	case GL_RG32UI:
		return 2;
	case GL_RGB8:
	case GL_RGB565:
		return 3;
	case GL_RGBA4:
	case GL_RGB5_A1:
	case GL_RGBA8:
	case GL_RGB10_A2:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA32I:
	case GL_RGBA32UI:
		return 4;
	default:
		return 0;
	}
}